

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O3

void __thiscall
Catch::Generators::Generators<short>::
Generators<Catch::Generators::GeneratorWrapper<short>,short,int>
          (Generators<short> *this,GeneratorWrapper<short> *moreGenerators,short *moreGenerators_1,
          int *moreGenerators_2)

{
  (this->super_IGenerator<short>).super_GeneratorUntypedBase.m_stringReprCache._M_dataplus._M_p =
       (pointer)&(this->super_IGenerator<short>).super_GeneratorUntypedBase.m_stringReprCache.
                 field_2;
  (this->super_IGenerator<short>).super_GeneratorUntypedBase.m_stringReprCache._M_string_length = 0;
  (this->super_IGenerator<short>).super_GeneratorUntypedBase.m_stringReprCache.field_2._M_local_buf
  [0] = '\0';
  (this->super_IGenerator<short>).super_GeneratorUntypedBase.m_currentElementIndex = 0;
  (this->super_IGenerator<short>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_004ef710;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<short>,_std::allocator<Catch::Generators::GeneratorWrapper<short>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<short>,_std::allocator<Catch::Generators::GeneratorWrapper<short>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_generators).
  super__Vector_base<Catch::Generators::GeneratorWrapper<short>,_std::allocator<Catch::Generators::GeneratorWrapper<short>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<short>,_std::allocator<Catch::Generators::GeneratorWrapper<short>_>_>
  ::reserve(&this->m_generators,3);
  add_generators<Catch::Generators::GeneratorWrapper<short>,short,int>
            (this,moreGenerators,moreGenerators_1,moreGenerators_2);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }